

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bocsu.cpp
# Opt level: O1

UChar32 u_writeIdenticalLevelRun_63(UChar32 prev,UChar *s,int32_t length,ByteSink *sink)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  char cVar9;
  char cVar10;
  uint uVar11;
  int32_t capacity;
  char scratch [64];
  int local_88;
  uint local_84;
  ByteSink *local_80;
  char local_78 [72];
  
  if (0 < length) {
    local_84 = length * 2;
    iVar7 = 0;
    local_80 = sink;
    do {
      iVar1 = (*local_80->_vptr_ByteSink[3])(local_80,1,(ulong)local_84,local_78,0x40,&local_88);
      pcVar2 = (char *)CONCAT44(extraout_var,iVar1);
      if (local_88 < 0x10) {
        local_88 = 0x40;
        pcVar2 = local_78;
      }
      pcVar3 = pcVar2;
      if (iVar7 < length) {
        do {
          if (pcVar2 + (long)local_88 + -4 < pcVar3) break;
          uVar5 = prev & 0xffffff80U | 0x50;
          if (0xffffadff < prev - 0xa000U) {
            uVar5 = 0x7654;
          }
          iVar1 = iVar7 + 1;
          prev = (UChar32)(ushort)s[iVar7];
          if ((iVar1 != length && (prev & 0xfc00U) == 0xd800) &&
             (lVar8 = (long)iVar1, ((ushort)s[lVar8] & 0xfc00) == 0xdc00)) {
            iVar1 = iVar7 + 2;
            prev = prev * 0x400 + (uint)(ushort)s[lVar8] + 0xfca02400;
          }
          if (prev == 0xfffe) {
            *pcVar3 = '\x02';
            pcVar3 = pcVar3 + 1;
            prev = 0;
          }
          else {
            uVar5 = prev - uVar5;
            if ((int)uVar5 < -0x50) {
              if ((int)uVar5 < -0x29ac) {
                iVar7 = (int)uVar5 % 0xfd;
                iVar6 = (iVar7 >> 0x1f) + (int)uVar5 / 0xfd;
                if (-1 < iVar7) {
                  iVar7 = 3;
                }
                uVar11 = iVar6 % 0xfd;
                iVar6 = ((int)uVar11 >> 0x1f) + iVar6 / 0xfd;
                if ((int)uVar5 < -0x2f112) {
                  pcVar3[3] = (char)iVar7;
                  if (-1 < (int)uVar11) {
                    uVar11 = 3;
                  }
                  iVar6 = iVar6 % 0xfd;
                  if (-1 < iVar6) {
                    iVar6 = 3;
                  }
                  pcVar3[2] = (char)uVar11;
                  pcVar3[1] = (char)iVar6;
                  *pcVar3 = '\x03';
                  pcVar3 = pcVar3 + 4;
                }
                else {
                  pcVar3[2] = (char)iVar7;
                  uVar5 = uVar11 - 3 & 0xff;
                  if (-1 < (int)uVar11) {
                    uVar5 = uVar11;
                  }
                  pcVar3[1] = (char)uVar5 + '\x03';
                  *pcVar3 = (char)iVar6 + '\a';
                  pcVar3 = pcVar3 + 3;
                }
              }
              else {
                iVar6 = (int)uVar5 % 0xfd;
                iVar7 = iVar6 >> 0x1f;
                if (-1 < iVar6) {
                  iVar6 = 3;
                }
                cVar4 = (char)iVar6;
                *pcVar3 = (char)iVar7 + (char)((int)uVar5 / 0xfd) + '1';
LAB_0022b3c8:
                pcVar3[1] = cVar4;
                pcVar3 = pcVar3 + 2;
              }
            }
            else {
              cVar4 = (char)uVar5;
              if ((int)uVar5 < 0x51) {
                *pcVar3 = cVar4 + -0x7f;
                pcVar3 = pcVar3 + 1;
              }
              else {
                if ((int)uVar5 < 0x29ac) {
                  *pcVar3 = (char)(uVar5 / 0xfd) + -0x2e;
                  cVar4 = cVar4 + (char)(uVar5 / 0xfd) * '\x03' + '\x03';
                  goto LAB_0022b3c8;
                }
                cVar10 = (char)(uVar5 / 0xfd);
                cVar9 = cVar4 + cVar10 * '\x03' + '\x03';
                cVar10 = cVar10 + (char)((ulong)uVar5 / 0xfa09) * '\x03' + '\x03';
                cVar4 = (char)(uVar5 / 0xfa09);
                if ((int)uVar5 < 0x2f112) {
                  pcVar3[2] = cVar9;
                  pcVar3[1] = cVar10;
                  *pcVar3 = cVar4 + -4;
                  pcVar3 = pcVar3 + 3;
                }
                else {
                  pcVar3[3] = cVar9;
                  pcVar3[2] = cVar10;
                  pcVar3[1] = cVar4 + (char)((ulong)(uVar5 / 0xfa09) * 0x103091c >> 0x20) * '\x03' +
                              '\x03';
                  *pcVar3 = -1;
                  pcVar3 = pcVar3 + 4;
                }
              }
            }
          }
          iVar7 = iVar1;
        } while (iVar1 < length);
      }
      (*local_80->_vptr_ByteSink[2])(local_80,pcVar2,(ulong)(uint)((int)pcVar3 - (int)pcVar2));
    } while (iVar7 < length);
  }
  return prev;
}

Assistant:

U_CFUNC UChar32
u_writeIdenticalLevelRun(UChar32 prev, const UChar *s, int32_t length, icu::ByteSink &sink) {
    char scratch[64];
    int32_t capacity;

    int32_t i=0;
    while(i<length) {
        char *buffer=sink.GetAppendBuffer(1, length*2, scratch, (int32_t)sizeof(scratch), &capacity);
        uint8_t *p;
        // We must have capacity>=SLOPE_MAX_BYTES in case u_writeDiff() writes that much,
        // but we do not want to force the sink.GetAppendBuffer() to allocate
        // for a large min_capacity because we might actually only write one byte.
        if(capacity<16) {
            buffer=scratch;
            capacity=(int32_t)sizeof(scratch);
        }
        p=reinterpret_cast<uint8_t *>(buffer);
        uint8_t *lastSafe=p+capacity-SLOPE_MAX_BYTES;
        while(i<length && p<=lastSafe) {
            if(prev<0x4e00 || prev>=0xa000) {
                prev=(prev&~0x7f)-SLOPE_REACH_NEG_1;
            } else {
                /*
                 * Unihan U+4e00..U+9fa5:
                 * double-bytes down from the upper end
                 */
                prev=0x9fff-SLOPE_REACH_POS_2;
            }

            UChar32 c;
            U16_NEXT(s, i, length, c);
            if(c==0xfffe) {
                *p++=2;  // merge separator
                prev=0;
            } else {
                p=u_writeDiff(c-prev, p);
                prev=c;
            }
        }
        sink.Append(buffer, (int32_t)(p-reinterpret_cast<uint8_t *>(buffer)));
    }
    return prev;
}